

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SFMT.cpp
# Opt level: O2

void __thiscall FRandom::PeriodCertification(FRandom *this)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  
  uVar1 = 0;
  for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 4) {
    uVar1 = uVar1 ^ *(uint *)((long)parity + lVar3) & *(uint *)((long)&this->sfmt + lVar3);
  }
  for (uVar2 = 0x10; uVar2 != 0; uVar2 = uVar2 >> 1) {
    uVar1 = uVar1 ^ (int)uVar1 >> (sbyte)uVar2;
  }
  if ((uVar1 & 1) == 0) {
    *(byte *)&this->sfmt = *(byte *)&this->sfmt ^ 1;
  }
  return;
}

Assistant:

void FRandom::PeriodCertification()
{
	int inner = 0;
	int i, j;
	DWORD work;

	for (i = 0; i < 4; i++)
		inner ^= sfmt.u[idxof(i)] & parity[i];
	for (i = 16; i > 0; i >>= 1)
		inner ^= inner >> i;
	inner &= 1;
	/* check OK */
	if (inner == 1) {
		return;
	}
	/* check NG, and modification */
	for (i = 0; i < 4; i++) {
		work = 1;
		for (j = 0; j < 32; j++) {
			if ((work & parity[i]) != 0) {
				sfmt.u[idxof(i)] ^= work;
				return;
			}
			work = work << 1;
		}
	}
}